

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_ask.cxx
# Opt level: O1

int innards(char *fmt,__va_list_tag *ap,char *b0,char *b1,char *b2)

{
  _func_int **pp_Var1;
  bool bVar2;
  Fl_Fontsize FVar3;
  Fl_Window *pFVar4;
  Fl_Box *pFVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined8 *puVar10;
  Fl_Group *g;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  undefined8 uVar14;
  Fl_Widget *this;
  uint uVar15;
  int *w;
  Fl_Button **ppFVar16;
  int *piVar17;
  int message_w;
  int message_h;
  int button_w [3];
  int button_h [3];
  char buffer [1024];
  uint local_470;
  uint local_46c;
  int local_468 [4];
  char *local_458;
  char *local_450;
  int local_448 [4];
  char local_438 [1032];
  
  Fl::pushed((Fl_Widget *)0x0);
  avoidRecursion = 1;
  makeform();
  (*(message_form->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (message_form,(ulong)(uint)(message_form->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(message_form->super_Fl_Group).super_Fl_Widget.y_,0x19a,0x67);
  iVar6 = strcmp(fmt,"%s");
  this = &message->super_Fl_Widget;
  if (iVar6 == 0) {
    uVar9 = ap->gp_offset;
    if ((ulong)uVar9 < 0x29) {
      puVar10 = (undefined8 *)((ulong)uVar9 + (long)ap->reg_save_area);
      ap->gp_offset = uVar9 + 8;
    }
    else {
      puVar10 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 1;
    }
    pcVar13 = (char *)*puVar10;
  }
  else {
    pcVar13 = local_438;
    vsnprintf(pcVar13,0x400,fmt,ap);
    this = &message->super_Fl_Widget;
  }
  Fl_Widget::label(this,pcVar13);
  pFVar5 = message;
  (message->super_Fl_Widget).label_.font = fl_message_font_;
  FVar3 = fl_message_size_;
  if (fl_message_size_ == -1) {
    FVar3 = FL_NORMAL_SIZE;
  }
  (pFVar5->super_Fl_Widget).label_.size = FVar3;
  pp_Var1 = (button[0]->super_Fl_Widget)._vptr_Fl_Widget;
  if (b0 == (char *)0x0) {
    (*pp_Var1[6])();
    uVar14 = 0x136;
  }
  else {
    (*pp_Var1[5])();
    Fl_Widget::label(&button[0]->super_Fl_Widget,b0);
    uVar14 = 0xd2;
  }
  (*(button[1]->super_Fl_Widget)._vptr_Fl_Widget[4])
            (button[1],uVar14,0x46,(ulong)(uint)(button[1]->super_Fl_Widget).w_,
             (ulong)(uint)(button[1]->super_Fl_Widget).h_);
  pp_Var1 = (button[1]->super_Fl_Widget)._vptr_Fl_Widget;
  if (b1 == (char *)0x0) {
    (*pp_Var1[6])();
  }
  else {
    (*pp_Var1[5])();
    Fl_Widget::label(&button[1]->super_Fl_Widget,b1);
  }
  pp_Var1 = (button[2]->super_Fl_Widget)._vptr_Fl_Widget;
  if (b2 == (char *)0x0) {
    (*pp_Var1[6])();
  }
  else {
    (*pp_Var1[5])();
    Fl_Widget::label(&button[2]->super_Fl_Widget,b2);
  }
  local_458 = (icon->super_Fl_Widget).label_.value;
  if (local_458 == (char *)0x0) {
    Fl_Widget::label(&icon->super_Fl_Widget,iconlabel);
  }
  (*(message_form->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (message_form,(ulong)(uint)(message_form->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(message_form->super_Fl_Group).super_Fl_Widget.y_,0x19a,0x67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)(message->super_Fl_Widget).label_.font,
             (ulong)(uint)(message->super_Fl_Widget).label_.size);
  local_46c = 0;
  local_470 = 0;
  fl_measure((message->super_Fl_Widget).label_.value,(int *)&local_470,(int *)&local_46c,1);
  bVar2 = (int)local_470 < 0x14a;
  local_470 = local_470 + 10;
  if (bVar2) {
    local_470 = 0x154;
  }
  bVar2 = (int)local_46c < 0x14;
  local_46c = local_46c + 10;
  if (bVar2) {
    local_46c = 0x1e;
  }
  ppFVar16 = button;
  local_450 = b0;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,(ulong)(uint)(button[0]->super_Fl_Widget).label_.font,
             (ulong)(uint)(button[0]->super_Fl_Widget).label_.size);
  lVar12 = 0;
  local_468[2] = 0;
  local_468[0] = 0;
  local_468[1] = 0;
  local_448[0] = 0;
  local_448[1] = 0;
  local_448[2] = 0;
  iVar6 = 0x19;
  do {
    if ((((*ppFVar16)->super_Fl_Widget).flags_ & 2) == 0) {
      w = (int *)((long)local_468 + lVar12);
      piVar17 = (int *)((long)local_448 + lVar12);
      fl_measure(((*ppFVar16)->super_Fl_Widget).label_.value,w,piVar17,1);
      if (lVar12 == 4) {
        local_468[1] = local_468[1] + 0x14;
      }
      *w = *w + 0x1e;
      iVar7 = *piVar17 + 10;
      *piVar17 = iVar7;
      if (iVar6 < iVar7) {
        iVar6 = iVar7;
      }
    }
    lVar12 = lVar12 + 4;
    ppFVar16 = ppFVar16 + 1;
  } while (lVar12 != 0xc);
  uVar9 = local_46c + 0x19;
  if (((input->super_Fl_Input_).super_Fl_Widget.flags_ & 2) != 0) {
    uVar9 = local_46c;
  }
  piVar17 = local_468;
  iVar8 = local_468[0] + local_468[1] + local_468[2] + -10;
  iVar7 = local_470 + 0x3c;
  if ((int)(local_470 + 0x3c) < iVar8) {
    iVar7 = iVar8;
  }
  local_470 = iVar7 - 0x3c;
  uVar15 = iVar7 + 0x14;
  uVar11 = iVar6 + uVar9 + 0x1e;
  (*(message_form->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
            (message_form,(ulong)(uint)(message_form->super_Fl_Group).super_Fl_Widget.x_,
             (ulong)(uint)(message_form->super_Fl_Group).super_Fl_Widget.y_,(ulong)uVar15,
             (ulong)uVar11);
  pFVar4 = message_form;
  message_form->minw = uVar15;
  pFVar4->minh = uVar11;
  pFVar4->maxw = uVar15;
  pFVar4->maxh = uVar11;
  pFVar4->dw = 0;
  pFVar4->dh = 0;
  pFVar4->aspect = 0;
  Fl_Window::size_range_(pFVar4);
  (*(message->super_Fl_Widget)._vptr_Fl_Widget[4])
            (message,0x46,10,(ulong)local_470,(ulong)local_46c);
  (*(icon->super_Fl_Widget)._vptr_Fl_Widget[4])(icon,10,10,0x32,0x32);
  (icon->super_Fl_Widget).label_.size = 0x28;
  (*(input->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[4])
            (input,0x46,(ulong)(local_46c + 10),(ulong)local_470,0x19);
  lVar12 = 0;
  do {
    iVar7 = *piVar17;
    if (iVar7 != 0) {
      uVar15 = uVar15 - iVar7;
      (**(code **)(**(long **)((long)button + lVar12) + 0x20))
                (*(long **)((long)button + lVar12),uVar15,uVar9 + 0x14,iVar7 + -10,iVar6);
    }
    lVar12 = lVar12 + 8;
    piVar17 = piVar17 + 1;
  } while (lVar12 != 0x18);
  if ((((button[1]->super_Fl_Widget).flags_ & 2) == 0) &&
     (((input->super_Fl_Input_).super_Fl_Widget.flags_ & 2) != 0)) {
    Fl_Widget::take_focus(&button[1]->super_Fl_Widget);
  }
  pcVar13 = local_450;
  if (enableHotspot != 0) {
    Fl_Window::hotspot(message_form,&button[0]->super_Fl_Widget,0);
  }
  if (pcVar13 != (char *)0x0) {
    uVar9 = Fl_Widget::label_shortcut(pcVar13);
    iVar6 = 0;
    if (uVar9 != 0) goto LAB_001920f8;
  }
  iVar6 = 0xff1b;
LAB_001920f8:
  button[0]->shortcut_ = iVar6;
  if (message_title_default != (char *)0x0 &&
      (message_form->super_Fl_Group).super_Fl_Widget.label_.value == (char *)0x0) {
    Fl_Window::label(message_form,message_title_default);
  }
  pFVar4 = Fl::grab_;
  if (Fl::grab_ != (Fl_Window *)0x0) {
    Fl::grab((Fl_Window *)0x0);
  }
  g = Fl_Group::current();
  (*(message_form->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl_Group::current(g);
  while (message_form->i != (Fl_X *)0x0) {
    Fl::wait(g);
  }
  if (pFVar4 != (Fl_Window *)0x0) {
    Fl::grab(pFVar4);
  }
  Fl_Widget::label(&icon->super_Fl_Widget,local_458);
  Fl_Window::label(message_form,(char *)0x0);
  avoidRecursion = 0;
  return ret_val;
}

Assistant:

static int innards(const char* fmt, va_list ap,
  const char *b0,
  const char *b1,
  const char *b2)
{
  Fl::pushed(0); // stop dragging (STR #2159)

  avoidRecursion = 1;

  makeform();
  message_form->size(410,103);
  char buffer[1024];
  if (!strcmp(fmt,"%s")) {
    message->label(va_arg(ap, const char*));
  } else {
    ::vsnprintf(buffer, 1024, fmt, ap);
    message->label(buffer);
  }

  message->labelfont(fl_message_font_);
  if (fl_message_size_ == -1)
    message->labelsize(FL_NORMAL_SIZE);
  else
    message->labelsize(fl_message_size_);
  if (b0) {button[0]->show(); button[0]->label(b0); button[1]->position(210,70);}
  else {button[0]->hide(); button[1]->position(310,70);}
  if (b1) {button[1]->show(); button[1]->label(b1);}
  else button[1]->hide();
  if (b2) {button[2]->show(); button[2]->label(b2);}
  else button[2]->hide();
  const char* prev_icon_label = icon->label();
  if (!prev_icon_label) icon->label(iconlabel);

  resizeform();

  if (button[1]->visible() && !input->visible())
    button[1]->take_focus();
  if (enableHotspot)
    message_form->hotspot(button[0]);
  if (b0 && Fl_Widget::label_shortcut(b0))
    button[0]->shortcut(0);
  else
    button[0]->shortcut(FL_Escape);

  // set default window title, if defined and a specific title is not set
  if (!message_form->label() && message_title_default)
    message_form->label(message_title_default);

  // deactivate Fl::grab(), because it is incompatible with modal windows
  Fl_Window* g = Fl::grab();
  if (g) Fl::grab(0);
  Fl_Group *current_group = Fl_Group::current(); // make sure the dialog does not interfere with any active group
  message_form->show();
  Fl_Group::current(current_group);
  while (message_form->shown()) Fl::wait();
  if (g) // regrab the previous popup menu, if there was one
    Fl::grab(g);
  icon->label(prev_icon_label);
  message_form->label(0); // reset window title

  avoidRecursion = 0;
  return ret_val;
}